

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_time.cc
# Opt level: O0

int asn1_time_to_tm(tm *tm,ASN1_TIME *t,int allow_timezone_offset)

{
  int iVar1;
  time_t time;
  int allow_timezone_offset_local;
  ASN1_TIME *t_local;
  tm *tm_local;
  
  if (t == (ASN1_TIME *)0x0) {
    time = ::time((time_t *)0x0);
    iVar1 = OPENSSL_posix_to_tm(time,tm);
    if (iVar1 == 0) {
      tm_local._4_4_ = 0;
    }
    else {
      tm_local._4_4_ = 1;
    }
  }
  else if (t->type == 0x17) {
    tm_local._4_4_ = asn1_utctime_to_tm(tm,t,allow_timezone_offset);
  }
  else if (t->type == 0x18) {
    tm_local._4_4_ = asn1_generalizedtime_to_tm(tm,t);
  }
  else {
    tm_local._4_4_ = 0;
  }
  return tm_local._4_4_;
}

Assistant:

static int asn1_time_to_tm(struct tm *tm, const ASN1_TIME *t,
                           int allow_timezone_offset) {
  if (t == NULL) {
    if (OPENSSL_posix_to_tm(time(NULL), tm)) {
      return 1;
    }
    return 0;
  }

  if (t->type == V_ASN1_UTCTIME) {
    return asn1_utctime_to_tm(tm, t, allow_timezone_offset);
  } else if (t->type == V_ASN1_GENERALIZEDTIME) {
    return asn1_generalizedtime_to_tm(tm, t);
  }

  return 0;
}